

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O2

void __thiscall
wigwag::detail::
listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::handler_node::release_token_impl(handler_node *this)

{
  atomic<int> *paVar1;
  intrusive_list_node *piVar2;
  intrusive_list_node *piVar3;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_listenable_impl_hpp:111:57)>
  sg;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_listenable_impl_hpp:111:57)>
  local_18;
  
  life_assurance::intrusive_life_tokens::life_assurance::release_life_assurance
            (&this->super_life_assurance,&((this->_listenable_impl)._raw)->super_shared_data);
  (*(this->super_implementation)._vptr_implementation[3])(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_handler).obj.
              super___shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  LOCK();
  paVar1 = &(this->super_life_assurance)._ref_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if ((paVar1->super___atomic_base<int>)._M_i == 0) {
    threading::shared_recursive_mutex::lock_primitive::lock_nonrecursive
              (&((this->_listenable_impl)._raw)->super_lock_primitive);
    local_18._moved = false;
    piVar2 = (this->super_intrusive_list_node)._prev;
    piVar3 = (this->super_intrusive_list_node)._next;
    piVar3->_prev = piVar2;
    piVar2->_next = piVar3;
    (this->super_intrusive_list_node)._next = &this->super_intrusive_list_node;
    (this->super_intrusive_list_node)._prev = &this->super_intrusive_list_node;
    local_18._f.this = this;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/include/wigwag/detail/listenable_impl.hpp:111:57)>
    ::~scope_guard(&local_18);
    (*(this->super_implementation)._vptr_implementation[2])(this);
  }
  return;
}

Assistant:

virtual void release_token_impl()
            {
                life_assurance::release_life_assurance(*_listenable_impl);

                if (!suppress_populator() && _listenable_impl->get_handler_processor().has_withdraw_state())
                {
                    _listenable_impl->get_lock_primitive().lock_nonrecursive();
                    auto sg = detail::at_scope_exit([&] { _listenable_impl->get_lock_primitive().unlock_nonrecursive(); } );
                    _listenable_impl->get_handler_processor().withdraw_state(_handler.ref());
                }

                _handler.ref().~handler_type();

                if (life_assurance::release_node())
                {
                    {
                        _listenable_impl->get_lock_primitive().lock_nonrecursive();
                        auto sg = detail::at_scope_exit([&] { _listenable_impl->get_lock_primitive().unlock_nonrecursive(); } );
                        _listenable_impl->get_handlers_container().erase(*this);
                    }
                    delete this;
                }
            }